

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O3

void pce_mml(int *ip)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ushort **ppuVar6;
  char cVar7;
  char *pcVar8;
  int iVar9;
  char mml [128];
  char acStack_b8 [136];
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar2 = mml_start(buffer);
  iVar3 = getstring(ip,acStack_b8,0x7f);
  if (iVar3 != 0) {
    iVar3 = 0x2000 - iVar2;
    while (iVar4 = mml_parse(buffer + iVar2,iVar3,acStack_b8), iVar4 != -1) {
      iVar2 = iVar2 + iVar4;
      iVar5 = *ip;
      iVar9 = iVar5 + 1;
      *ip = iVar9;
      cVar7 = prlnbuf[iVar5];
      if (cVar7 != ',') {
        if ((cVar7 == '\0') || (cVar7 == ';')) {
          iVar3 = mml_stop(buffer + iVar2);
          putbuffer(buffer,iVar2 + iVar3);
          if (pass != 1) {
            return;
          }
          println();
          return;
        }
LAB_00110ebb:
        error("Syntax error!");
        return;
      }
      ppuVar6 = __ctype_b_loc();
      puVar1 = *ppuVar6;
      cVar7 = prlnbuf[iVar9];
      if ((*(byte *)((long)puVar1 + (long)cVar7 * 2 + 1) & 0x20) != 0) {
        pcVar8 = prlnbuf + (long)iVar9 + 1;
        do {
          iVar9 = iVar9 + 1;
          *ip = iVar9;
          cVar7 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while ((*(byte *)((long)puVar1 + (long)cVar7 * 2 + 1) & 0x20) != 0);
      }
      if (cVar7 == '\\') {
        pcVar8 = prlnbuf + iVar9;
        do {
          iVar9 = iVar9 + 1;
          pcVar8 = pcVar8 + 1;
          *ip = iVar9;
          cVar7 = *pcVar8;
        } while ((*(byte *)((long)puVar1 + (long)cVar7 * 2 + 1) & 0x20) != 0);
        if ((cVar7 != ';') && (cVar7 != '\0')) goto LAB_00110ebb;
        if (pass == 1) {
          println();
          clearln();
        }
        iVar5 = readline();
        if (iVar5 == -1) {
          return;
        }
        *ip = 0x1a;
      }
      iVar3 = iVar3 - iVar4;
      iVar4 = getstring(ip,acStack_b8,0x7f);
      if (iVar4 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
pce_mml(int *ip)
{
	int offset, bufsize, size;
	char mml[128];
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* start */
	bufsize = 8192;
	offset = mml_start(buffer);
	bufsize -= offset;

	/* extract and parse mml string(s) */
	for (;;) {
		/* get string */
		if (!getstring(ip, mml, 127))
			return;

		/* parse string */
		size = mml_parse(buffer + offset, bufsize, mml);

		if (size == -1)
			return;

		/* adjust buffer size */
		offset  += size;
		bufsize -= size;

		/* next string */
		c = prlnbuf[(*ip)++];

		if ((c != ',') && (c != ';') && (c != '\0')) {
			error("Syntax error!");
			return;
		}
		if (c != ',')
			break;

		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* continuation char */
		if (prlnbuf[*ip] == '\\') {
			(*ip)++;

			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* check */
			if (prlnbuf[*ip] == ';' || prlnbuf[*ip] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return;
				
				/* rewind line pointer and continue */
				*ip = SFIELD;
			}
			else {
				error("Syntax error!");
				return;
			}
		}
	}			

	/* stop */
	offset += mml_stop(buffer + offset);

	/* store data */
	putbuffer(buffer, offset);

	/* output */
	if (pass == LAST_PASS)
		println();
}